

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

int Vec_IntCountNonTrivial(Vec_Ptr_t *vEquivs,int *pnUsed)

{
  int iVar1;
  void **ppvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  *pnUsed = 0;
  iVar5 = vEquivs->nSize;
  if (0 < iVar5) {
    ppvVar2 = vEquivs->pArray;
    iVar4 = 0;
    lVar6 = 0;
    iVar3 = 0;
    do {
      iVar1 = *(int *)((long)ppvVar2[lVar6] + 4);
      if (1 < iVar1) {
        iVar3 = iVar3 + 1;
        iVar4 = iVar4 + iVar1;
        *pnUsed = iVar4;
        iVar5 = vEquivs->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
    return iVar3;
  }
  return 0;
}

Assistant:

int Vec_IntCountNonTrivial( Vec_Ptr_t * vEquivs, int * pnUsed )
{
    Vec_Int_t * vClass;
    int i, nClasses = 0;
    *pnUsed = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vEquivs, vClass, i )
    {
        if ( Vec_IntSize(vClass) < 2 )
            continue;
        nClasses++;
        (*pnUsed) += Vec_IntSize(vClass);
    }
    return nClasses;
}